

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_res.h
# Opt level: O3

void __thiscall
hiberlite::shared_cnt_obj_pair<hiberlite::autoclosed_con>::~shared_cnt_obj_pair
          (shared_cnt_obj_pair<hiberlite::autoclosed_con> *this)

{
  autoclosed_con *paVar1;
  logic_error *this_00;
  
  this->_vptr_shared_cnt_obj_pair = (_func_int **)&PTR__shared_cnt_obj_pair_00199a28;
  if (this->refCount == 0) {
    paVar1 = this->res;
    if ((paVar1 != (autoclosed_con *)0x0) && (paVar1->con != (sqlite3 *)0x0)) {
      sqlite3_close(paVar1->con);
    }
    operator_delete(paVar1);
    operator_delete(this);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"resource is busy");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline virtual ~shared_cnt_obj_pair(){
		if(refCount)
			throw std::logic_error("resource is busy");
		delete res;
	}